

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unz64local_getShort(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,uLong *pX)

{
  uint in_EAX;
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar1 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_28 + 4));
  uVar4 = (ulong)uStack_28._4_4_;
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = unz64local_getByte(pzlib_filefunc_def,filestream,(int *)((long)&uStack_28 + 4));
  }
  uVar3 = 0;
  if (iVar2 == 0) {
    uVar3 = (long)uStack_28._4_4_ << 8 | uVar4;
  }
  *pX = uVar3;
  return iVar2;
}

Assistant:

local int unz64local_getShort(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    uLong* pX)
{
    uLong x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (uLong)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((uLong)i) << 8;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}